

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_format.hpp
# Opt level: O2

ssize_t lightconf::config_format::read(int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_0000003c;
  scanner sc;
  scanner_params local_b0;
  scanner local_88;
  
  local_88.input_._M_dataplus._M_p = (pointer)&local_88.input_.field_2;
  local_88.input_._M_string_length = 0;
  local_88.input_.field_2._M_local_buf[0] = '\0';
  local_88.tokens_.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.tokens_.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  local_88.tokens_.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  local_88.tokens_.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_88._52_8_ = 0;
  local_88.eof_ = true;
  local_88.pos_ = 0;
  local_88.line_ = 1;
  local_88.col_ = 1;
  local_88.params_.comment_function.super__Function_base._M_functor._M_unused._M_object =
       (void *)0x0;
  local_88.params_.comment_function.super__Function_base._M_functor._8_8_ = 0;
  local_88.params_.comment_function.super__Function_base._M_manager = (_Manager_type)0x0;
  local_88.params_.comment_function._M_invoker = (_Invoker_type)0x0;
  local_88.params_.flags = 0;
  scanner_params::scanner_params(&local_b0,(scanner_params *)default_scanner_params);
  scanner::scan(&local_88,(string *)__buf,&local_b0);
  std::_Function_base::~_Function_base((_Function_base *)&local_b0);
  read_group((group *)CONCAT44(in_register_0000003c,__fd),&local_88,false);
  scanner::~scanner(&local_88);
  return (ssize_t)(group *)CONCAT44(in_register_0000003c,__fd);
}

Assistant:

inline group read(const std::string& src) {
    scanner sc;
    sc.scan(src);
    return read_group(sc, false);
}